

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngpread.c
# Opt level: O0

void png_push_fill_buffer(png_structp png_ptr,png_bytep buffer,size_t length)

{
  png_bytep local_38;
  size_t save_size_1;
  size_t save_size;
  png_bytep ptr;
  size_t length_local;
  png_bytep buffer_local;
  png_structp png_ptr_local;
  
  if (png_ptr != (png_structp)0x0) {
    save_size = (size_t)buffer;
    ptr = (png_bytep)length;
    if (png_ptr->save_buffer_size != 0) {
      save_size_1 = length;
      if (png_ptr->save_buffer_size <= length) {
        save_size_1 = png_ptr->save_buffer_size;
      }
      memcpy(buffer,png_ptr->save_buffer_ptr,save_size_1);
      ptr = (png_bytep)(length - save_size_1);
      save_size = (size_t)(buffer + save_size_1);
      png_ptr->buffer_size = png_ptr->buffer_size - save_size_1;
      png_ptr->save_buffer_size = png_ptr->save_buffer_size - save_size_1;
      png_ptr->save_buffer_ptr = png_ptr->save_buffer_ptr + save_size_1;
    }
    if ((ptr != (png_bytep)0x0) && (png_ptr->current_buffer_size != 0)) {
      if (ptr < (png_bytep)png_ptr->current_buffer_size) {
        local_38 = ptr;
      }
      else {
        local_38 = (png_bytep)png_ptr->current_buffer_size;
      }
      memcpy((void *)save_size,png_ptr->current_buffer_ptr,(size_t)local_38);
      png_ptr->buffer_size = png_ptr->buffer_size - (long)local_38;
      png_ptr->current_buffer_size = png_ptr->current_buffer_size - (long)local_38;
      png_ptr->current_buffer_ptr = local_38 + (long)png_ptr->current_buffer_ptr;
    }
  }
  return;
}

Assistant:

void PNGCBAPI
png_push_fill_buffer(png_structp png_ptr, png_bytep buffer, size_t length)
{
   png_bytep ptr;

   if (png_ptr == NULL)
      return;

   ptr = buffer;
   if (png_ptr->save_buffer_size != 0)
   {
      size_t save_size;

      if (length < png_ptr->save_buffer_size)
         save_size = length;

      else
         save_size = png_ptr->save_buffer_size;

      memcpy(ptr, png_ptr->save_buffer_ptr, save_size);
      length -= save_size;
      ptr += save_size;
      png_ptr->buffer_size -= save_size;
      png_ptr->save_buffer_size -= save_size;
      png_ptr->save_buffer_ptr += save_size;
   }
   if (length != 0 && png_ptr->current_buffer_size != 0)
   {
      size_t save_size;

      if (length < png_ptr->current_buffer_size)
         save_size = length;

      else
         save_size = png_ptr->current_buffer_size;

      memcpy(ptr, png_ptr->current_buffer_ptr, save_size);
      png_ptr->buffer_size -= save_size;
      png_ptr->current_buffer_size -= save_size;
      png_ptr->current_buffer_ptr += save_size;
   }
}